

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O3

void __thiscall QWhatsThat::paintEvent(QWhatsThat *this,QPaintEvent *param_1)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  QWidgetData *pQVar4;
  bool bVar5;
  Representation RVar6;
  QPalette *pQVar7;
  QBrush *pQVar8;
  long *plVar9;
  long lVar10;
  int iVar11;
  byte unaff_BPL;
  undefined8 *puVar12;
  undefined8 *puVar13;
  uint uVar14;
  uint uVar15;
  byte bVar16;
  long in_FS_OFFSET;
  byte bVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  QPainter p;
  PaintContext context;
  undefined8 local_b8;
  int iStack_b0;
  int iStack_ac;
  QPoint local_a0;
  QPoint local_98;
  int iStack_90;
  int iStack_8c;
  undefined1 local_88 [12];
  int iStack_7c;
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  qsizetype local_40;
  long local_38;
  
  plVar9 = QGuiApplicationPrivate::platform_theme;
  bVar17 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (QGuiApplicationPrivate::platform_theme != (long *)0x0) {
    (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x60))
              ((QVariant *)local_88,QGuiApplicationPrivate::platform_theme,9);
    unaff_BPL = ::QVariant::toBool();
    ::QVariant::~QVariant((QVariant *)local_88);
  }
  bVar16 = plVar9 != (long *)0x0 & unaff_BPL;
  pQVar4 = (this->super_QWidget).data;
  local_98.xp.m_i = 0;
  local_98.yp.m_i = 0;
  uVar2 = (pQVar4->crect).x2;
  uVar3 = (pQVar4->crect).y2;
  iStack_90 = ((pQVar4->crect).x1.m_i ^ 0xffffffffU) + uVar2;
  iStack_8c = ((pQVar4->crect).y1.m_i ^ 0xffffffffU) + uVar3;
  if (bVar16 == 1) {
    iStack_90 = iStack_90 - shadowWidth;
    iStack_8c = iStack_8c - shadowWidth;
  }
  local_a0 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_a0,&(this->super_QWidget).super_QPaintDevice);
  pQVar7 = QWidget::palette(&this->super_QWidget);
  pQVar8 = (QBrush *)QPalette::brush((ColorGroup)pQVar7,Dark);
  QPen::QPen((QPen *)local_88,pQVar8,0.0,SolidLine,SquareCap,BevelJoin);
  QPainter::setPen((QPen *)&local_a0);
  QPen::~QPen((QPen *)local_88);
  pQVar7 = QWidget::palette(&this->super_QWidget);
  QPalette::brush((ColorGroup)pQVar7,Dark);
  QPainter::setBrush((QBrush *)&local_a0);
  QPainter::drawRects((QRect *)&local_a0,(int)&local_98);
  iVar19 = iStack_90 - (int)local_98.xp.m_i;
  iVar20 = iStack_8c - (int)local_98.yp.m_i;
  pQVar7 = QWidget::palette(&this->super_QWidget);
  QPalette::brush((ColorGroup)pQVar7,Dark);
  QPainter::setPen((QColor *)&local_a0);
  register0x00001200 = CONCAT44(iVar20 + -1,iVar19 + -1);
  local_88._0_8_ = (PrivateShared *)0x100000001;
  QPainter::drawRects((QRect *)&local_a0,(int)local_88);
  if (bVar16 != 0) {
    iVar18 = iVar20 + 1;
    pQVar7 = QWidget::palette(&this->super_QWidget);
    QPalette::brush((ColorGroup)pQVar7,Dark);
    QPainter::setPen((QColor *)&local_a0);
    iVar1 = iVar19 + 6;
    local_88._4_4_ = 6;
    local_88._0_4_ = iVar1;
    QPainter::drawPoints(&local_a0,(int)local_88);
    local_88._4_4_ = 6;
    local_88._0_4_ = iVar19 + 4;
    iStack_7c = 8;
    local_88._8_4_ = iVar1;
    QPainter::drawLines((QLine *)&local_a0,(int)local_88);
    local_88._4_4_ = 6;
    local_88._0_4_ = iVar19 + 2;
    iStack_7c = 10;
    QPainter::drawLines((QLine *)&local_a0,(int)local_88);
    iVar11 = 7;
    if (7 < iVar18) {
      iVar11 = 7;
      do {
        local_88._4_4_ = iVar11;
        local_88._0_4_ = iVar19 + 1;
        iStack_7c = iVar11 + 5;
        QPainter::drawLines((QLine *)&local_a0,(int)local_88);
        iVar11 = iVar11 + 2;
      } while (iVar11 < iVar18);
    }
    uVar14 = (iVar19 + 1 + iVar18) - iVar11;
    if ((int)uVar14 < 7) {
      if ((int)uVar14 < 1) goto LAB_003a0f3d;
    }
    else {
      uVar15 = uVar14;
      do {
        local_88._4_4_ = iVar18;
        local_88._0_4_ = uVar15;
        iStack_7c = iVar20 + 6;
        local_88._8_4_ = uVar15 + 5;
        QPainter::drawLines((QLine *)&local_a0,(int)local_88);
        uVar14 = uVar15 - 2;
        bVar5 = 8 < uVar15;
        uVar15 = uVar14;
      } while (bVar5);
    }
    uVar15 = uVar14 + 2;
    iVar19 = (iVar18 - uVar14) + 6;
    do {
      local_88._4_4_ = iVar19;
      local_88._0_4_ = 6;
      iStack_7c = iVar20 + 6;
      local_88._8_4_ = uVar15 + 3;
      QPainter::drawLines((QLine *)&local_a0,(int)local_88);
      uVar15 = uVar15 - 2;
      iVar19 = iVar19 + 2;
    } while (2 < uVar15);
  }
LAB_003a0f3d:
  iStack_90 = iStack_90 + 1;
  iStack_8c = iStack_8c + 1;
  pQVar7 = QWidget::palette(&this->super_QWidget);
  QPalette::brush((ColorGroup)pQVar7,Dark);
  QPainter::setPen((QColor *)&local_a0);
  RVar6.m_i = (int)local_98.yp.m_i;
  local_98.xp.m_i = (int)local_98.xp.m_i + 0xc;
  local_98.yp.m_i = RVar6.m_i + 8;
  iStack_90 = iStack_90 + -0xc;
  iStack_8c = iStack_8c + -8;
  if (this->doc == (QTextDocument *)0x0) {
    QPainter::drawText((QRect *)&local_a0,(int)&local_98,(QString *)0x1421,(QRect *)&this->text);
  }
  else {
    local_88._0_8_ = (undefined8)local_98.xp.m_i;
    register0x00001208 = (undefined8)local_98.yp.m_i;
    QPainter::translate((QPointF *)&local_a0);
    local_b8 = 0;
    _iStack_b0 = CONCAT44(iStack_8c - local_98.yp.m_i,iStack_90 - local_98.xp.m_i);
    QPainter::setClipRect((QRect *)&local_a0,(ClipOperation)&local_b8);
    puVar12 = &DAT_006cef48;
    puVar13 = (undefined8 *)local_88;
    for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
      *puVar13 = *puVar12;
      puVar12 = puVar12 + (ulong)bVar17 * -2 + 1;
      puVar13 = puVar13 + (ulong)bVar17 * -2 + 1;
    }
    local_88._0_4_ = 0xffffffff;
    pQVar7 = (QPalette *)(local_88 + 8);
    QPalette::QPalette(pQVar7);
    local_50 = (undefined1  [16])0x0;
    local_60 = (undefined1  [16])0x0;
    local_70 = (undefined1  [16])0x0;
    local_40 = 0;
    QPalette::brush((ColorGroup)pQVar7,Dark);
    QPalette::setBrush((ColorGroup)pQVar7,Mid,(QBrush *)0x6);
    plVar9 = (long *)QTextDocument::documentLayout();
    (**(code **)(*plVar9 + 0x60))(plVar9,(QRect *)&local_a0,local_88);
    QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::~QArrayDataPointer
              ((QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)local_50);
    QPalette::~QPalette(pQVar7);
  }
  QPainter::~QPainter((QPainter *)&local_a0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWhatsThat::paintEvent(QPaintEvent*)
{
    const bool drawShadow = dropShadow();

    QRect r = rect();
    r.adjust(0, 0, -1, -1);
    if (drawShadow)
        r.adjust(0, 0, -shadowWidth, -shadowWidth);
    QPainter p(this);
    p.setPen(QPen(palette().toolTipText(), 0));
    p.setBrush(palette().toolTipBase());
    p.drawRect(r);
    int w = r.width();
    int h = r.height();
    p.setPen(palette().brush(QPalette::Dark).color());
    p.drawRect(1, 1, w-2, h-2);
    if (drawShadow) {
        p.setPen(palette().shadow().color());
        p.drawPoint(w + 5, 6);
        p.drawLine(w + 3, 6, w + 5, 8);
        p.drawLine(w + 1, 6, w + 5, 10);
        int i;
        for(i=7; i < h; i += 2)
            p.drawLine(w, i, w + 5, i + 5);
        for(i = w - i + h; i > 6; i -= 2)
            p.drawLine(i, h, i + 5, h + 5);
        for(; i > 0 ; i -= 2)
            p.drawLine(6, h + 6 - i, i + 5, h + 5);
    }
    r.adjust(0, 0, 1, 1);
    p.setPen(palette().toolTipText().color());
    r.adjust(hMargin, vMargin, -hMargin, -vMargin);

    if (doc) {
        p.translate(r.x(), r.y());
        QRect rect = r;
        rect.translate(-r.x(), -r.y());
        p.setClipRect(rect);
        QAbstractTextDocumentLayout::PaintContext context;
        context.palette.setBrush(QPalette::Text, context.palette.toolTipText());
        doc->documentLayout()->draw(&p, context);
    }
    else
    {
        p.drawText(r, Qt::AlignLeft | Qt::AlignTop | Qt::TextWordWrap | Qt::TextExpandTabs, text);
    }
}